

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O3

descriptor_state *
asio::detail::object_pool_access::create<asio::detail::epoll_reactor::descriptor_state,bool>
          (bool arg)

{
  descriptor_state *pdVar1;
  
  pdVar1 = (descriptor_state *)operator_new(0xa8);
  (pdVar1->super_operation).next_ = (scheduler_operation *)0x0;
  (pdVar1->super_operation).func_ = epoll_reactor::descriptor_state::do_complete;
  (pdVar1->super_operation).task_result_ = 0;
  posix_mutex::posix_mutex(&(pdVar1->mutex_).mutex_);
  (pdVar1->mutex_).enabled_ = arg;
  pdVar1->op_queue_[0].front_ = (reactor_op *)0x0;
  pdVar1->op_queue_[0].back_ = (reactor_op *)0x0;
  pdVar1->op_queue_[1].front_ = (reactor_op *)0x0;
  pdVar1->op_queue_[1].back_ = (reactor_op *)0x0;
  pdVar1->op_queue_[2].front_ = (reactor_op *)0x0;
  pdVar1->op_queue_[2].back_ = (reactor_op *)0x0;
  return pdVar1;
}

Assistant:

static Object* create(Arg arg)
  {
    return new Object(arg);
  }